

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# getcolb.c
# Opt level: O1

int ffgpvb(fitsfile *fptr,long group,LONGLONG firstelem,LONGLONG nelem,uchar nulval,uchar *array,
          int *anynul,int *status)

{
  int iVar1;
  undefined8 in_RAX;
  undefined6 uStack_38;
  uchar nullvalue;
  char cdummy;
  
  _uStack_38 = in_RAX;
  iVar1 = fits_is_compressed_image(fptr,status);
  if (iVar1 == 0) {
    if (group < 2) {
      group = 1;
    }
    ffgclb(fptr,2,group,firstelem,nelem,1,1,nulval,array,&cdummy,anynul,status);
  }
  else {
    _uStack_38 = CONCAT16(nulval,uStack_38);
    fits_read_compressed_pixels
              (fptr,0xb,firstelem,nelem,1,&nullvalue,array,(char *)0x0,anynul,status);
  }
  return *status;
}

Assistant:

int ffgpvb( fitsfile *fptr,   /* I - FITS file pointer                       */
            long  group,      /* I - group to read (1 = 1st group)           */
            LONGLONG  firstelem,  /* I - first vector element to read (1 = 1st)  */
            LONGLONG  nelem,      /* I - number of values to read                */
            unsigned char nulval, /* I - value for undefined pixels          */
            unsigned char *array, /* O - array of values that are returned   */
            int  *anynul,     /* O - set to 1 if any values are null; else 0 */
            int  *status)     /* IO - error status                           */
/*
  Read an array of values from the primary array. Data conversion
  and scaling will be performed if necessary (e.g, if the datatype of
  the FITS array is not the same as the array being read).
  Undefined elements will be set equal to NULVAL, unless NULVAL=0
  in which case no checking for undefined values will be performed.
  ANYNUL is returned with a value of .true. if any pixels are undefined.
*/
{
    long row;
    char cdummy;
    int nullcheck = 1;
    unsigned char nullvalue;

    if (fits_is_compressed_image(fptr, status))
    {
        /* this is a compressed image in a binary table */
         nullvalue = nulval;  /* set local variable */

        fits_read_compressed_pixels(fptr, TBYTE, firstelem, nelem,
            nullcheck, &nullvalue, array, NULL, anynul, status);
        return(*status);
    }
    /*
      the primary array is represented as a binary table:
      each group of the primary array is a row in the table,
      where the first column contains the group parameters
      and the second column contains the image itself.
    */

    row=maxvalue(1,group);

    ffgclb(fptr, 2, row, firstelem, nelem, 1, 1, nulval,
               array, &cdummy, anynul, status);
    return(*status);
}